

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

longlong mkvparser::ReadUInt(IMkvReader *pReader,longlong pos,long *len)

{
  int iVar1;
  ulong in_RAX;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  uchar b;
  undefined8 uStack_38;
  
  uVar4 = 0xfffffffffffffffe;
  if (-1 < pos && pReader != (IMkvReader *)0x0) {
    *len = 1;
    uStack_38 = in_RAX;
    iVar1 = (**pReader->_vptr_IMkvReader)(pReader,pos,1,(long)&uStack_38 + 7);
    if (iVar1 < 0) {
LAB_0010e92a:
      uVar4 = (ulong)iVar1;
    }
    else {
      uVar4 = 0xfffffffffffffffd;
      if (iVar1 == 0) {
        if (uStack_38._7_1_ == 0) {
          uVar4 = 0xfffffffffffffffe;
        }
        else {
          if ((long)uStack_38 < 0) {
            uVar3 = 0xffffff7f;
          }
          else {
            lVar2 = *len;
            uVar3 = 0x80;
            do {
              uVar3 = uVar3 >> 1;
              lVar2 = lVar2 + 1;
            } while ((uVar3 & uStack_38._7_1_) == 0);
            *len = lVar2;
            uVar3 = ~uVar3;
          }
          uVar4 = (ulong)(uVar3 & uStack_38._7_1_);
          if (1 < *len) {
            lVar2 = 1;
            do {
              iVar1 = (**pReader->_vptr_IMkvReader)(pReader,pos + lVar2,1,(long)&uStack_38 + 7);
              if (iVar1 < 0) {
                *len = 1;
                goto LAB_0010e92a;
              }
              if (iVar1 != 0) {
                *len = 1;
                return -3;
              }
              uVar4 = uVar4 << 8 | uStack_38 >> 0x38;
              lVar2 = lVar2 + 1;
            } while (lVar2 < *len);
          }
        }
      }
    }
  }
  return uVar4;
}

Assistant:

long long ReadUInt(IMkvReader* pReader, long long pos, long& len) {
  if (!pReader || pos < 0)
    return E_FILE_FORMAT_INVALID;

  len = 1;
  unsigned char b;
  int status = pReader->Read(pos, 1, &b);

  if (status < 0)  // error or underflow
    return status;

  if (status > 0)  // interpreted as "underflow"
    return E_BUFFER_NOT_FULL;

  if (b == 0)  // we can't handle u-int values larger than 8 bytes
    return E_FILE_FORMAT_INVALID;

  unsigned char m = 0x80;

  while (!(b & m)) {
    m >>= 1;
    ++len;
  }

  long long result = b & (~m);
  ++pos;

  for (int i = 1; i < len; ++i) {
    status = pReader->Read(pos, 1, &b);

    if (status < 0) {
      len = 1;
      return status;
    }

    if (status > 0) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result <<= 8;
    result |= b;

    ++pos;
  }

  return result;
}